

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightedgraph.cpp
# Opt level: O0

DEdgeVec * libDAI::GrowRootedTree(Graph *T,size_t Root)

{
  size_t m1;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  pointer pUVar4;
  DEdgeVec *in_RDI;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar5;
  bool e2_in_treeV;
  bool e1_in_treeV;
  iterator e;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> treeV;
  Graph Gr;
  DEdgeVec *result;
  iterator in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  _Rb_tree_const_iterator<unsigned_long> in_stack_fffffffffffffe68;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffffe70;
  value_type_conflict2 *in_stack_fffffffffffffe78;
  iterator in_stack_fffffffffffffe80;
  DEdge local_f8;
  _Base_ptr local_e8;
  _Base_ptr local_e0;
  _Base_ptr local_d8;
  undefined1 local_d0;
  DEdge local_c8;
  undefined1 local_b2;
  byte local_b1;
  _Self local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98;
  undefined4 local_20;
  byte local_19;
  
  local_19 = 0;
  std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::vector
            ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)0xbacb4c);
  sVar2 = std::set<libDAI::UEdge,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>::size
                    ((set<libDAI::UEdge,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_> *
                     )0xbacb59);
  if (sVar2 == 0) {
    local_19 = 1;
    local_20 = 1;
  }
  else {
    std::set<libDAI::UEdge,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>::set
              ((set<libDAI::UEdge,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_> *)
               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (set<libDAI::UEdge,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_> *)
               in_stack_fffffffffffffe58._M_node);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               0xbacba0);
    pVar5 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
            insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffe80._M_node,in_stack_fffffffffffffe78);
    local_a8._8_8_ = pVar5.first._M_node;
    local_98 = pVar5.second;
    while (bVar1 = std::set<libDAI::UEdge,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>
                   ::empty((set<libDAI::UEdge,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>
                            *)0xbacbe2), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_a8._0_8_ =
           std::set<libDAI::UEdge,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>::begin
                     ((set<libDAI::UEdge,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>
                       *)in_stack_fffffffffffffe58._M_node);
      while( true ) {
        local_b0._M_node =
             (_Base_ptr)
             std::set<libDAI::UEdge,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>::end
                       (in_stack_fffffffffffffe58._M_node);
        bVar1 = std::operator!=((_Self *)local_a8,&local_b0);
        if (!bVar1) break;
        std::_Rb_tree_const_iterator<libDAI::UEdge>::operator->
                  ((_Rb_tree_const_iterator<libDAI::UEdge> *)
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        sVar3 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                count(in_stack_fffffffffffffe70,(key_type *)in_stack_fffffffffffffe68._M_node);
        local_b1 = sVar3 != 0;
        std::_Rb_tree_const_iterator<libDAI::UEdge>::operator->
                  ((_Rb_tree_const_iterator<libDAI::UEdge> *)
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        sVar3 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                count(in_stack_fffffffffffffe70,(key_type *)in_stack_fffffffffffffe68._M_node);
        local_b2 = sVar3 != 0;
        if ((local_b1 & 1) == 0) {
          if ((bool)local_b2) {
            in_stack_fffffffffffffe70 =
                 (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 local_a8;
            pUVar4 = std::_Rb_tree_const_iterator<libDAI::UEdge>::operator->
                               ((_Rb_tree_const_iterator<libDAI::UEdge> *)
                                CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
            in_stack_fffffffffffffe78 = (value_type_conflict2 *)pUVar4->n2;
            pUVar4 = std::_Rb_tree_const_iterator<libDAI::UEdge>::operator->
                               ((_Rb_tree_const_iterator<libDAI::UEdge> *)
                                CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
            DEdge::DEdge(&local_f8,(size_t)in_stack_fffffffffffffe78,pUVar4->n1);
            std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::push_back
                      ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                       CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       (value_type *)in_stack_fffffffffffffe58._M_node);
            std::_Rb_tree_const_iterator<libDAI::UEdge>::operator->
                      ((_Rb_tree_const_iterator<libDAI::UEdge> *)
                       CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
            pVar5 = std::
                    set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                    insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)in_stack_fffffffffffffe80._M_node,in_stack_fffffffffffffe78);
            in_stack_fffffffffffffe68 = pVar5.first._M_node;
            in_stack_fffffffffffffe64 = CONCAT13(pVar5.second,(int3)in_stack_fffffffffffffe64);
            std::_Rb_tree_const_iterator<libDAI::UEdge>::operator++
                      ((_Rb_tree_const_iterator<libDAI::UEdge> *)in_stack_fffffffffffffe68._M_node,
                       in_stack_fffffffffffffe64);
            in_stack_fffffffffffffe58 =
                 std::set<libDAI::UEdge,std::less<libDAI::UEdge>,std::allocator<libDAI::UEdge>>::
                 erase_abi_cxx11_((set<libDAI::UEdge,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>
                                   *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                                  in_stack_fffffffffffffe68._M_node);
          }
          else {
            std::_Rb_tree_const_iterator<libDAI::UEdge>::operator++
                      ((_Rb_tree_const_iterator<libDAI::UEdge> *)in_stack_fffffffffffffe68._M_node,
                       in_stack_fffffffffffffe64);
          }
        }
        else {
          pUVar4 = std::_Rb_tree_const_iterator<libDAI::UEdge>::operator->
                             ((_Rb_tree_const_iterator<libDAI::UEdge> *)
                              CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          m1 = pUVar4->n1;
          pUVar4 = std::_Rb_tree_const_iterator<libDAI::UEdge>::operator->
                             ((_Rb_tree_const_iterator<libDAI::UEdge> *)
                              CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          DEdge::DEdge(&local_c8,m1,pUVar4->n2);
          std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::push_back
                    ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                     CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     (value_type *)in_stack_fffffffffffffe58._M_node);
          std::_Rb_tree_const_iterator<libDAI::UEdge>::operator->
                    ((_Rb_tree_const_iterator<libDAI::UEdge> *)
                     CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          pVar5 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)in_stack_fffffffffffffe80._M_node,in_stack_fffffffffffffe78);
          local_d8 = (_Base_ptr)pVar5.first._M_node;
          local_d0 = pVar5.second;
          local_e0 = (_Base_ptr)
                     std::_Rb_tree_const_iterator<libDAI::UEdge>::operator++
                               (in_stack_fffffffffffffe68._M_node,in_stack_fffffffffffffe64);
          in_stack_fffffffffffffe80 =
               std::set<libDAI::UEdge,std::less<libDAI::UEdge>,std::allocator<libDAI::UEdge>>::
               erase_abi_cxx11_((set<libDAI::UEdge,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>
                                 *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                                in_stack_fffffffffffffe68._M_node);
          local_e8 = in_stack_fffffffffffffe80._M_node;
        }
      }
    }
    local_19 = 1;
    local_20 = 1;
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               0xbacefa);
    std::set<libDAI::UEdge,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>::~set
              ((set<libDAI::UEdge,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_> *)
               0xbacf07);
  }
  if ((local_19 & 1) == 0) {
    std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::~vector
              ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)in_stack_fffffffffffffe70);
  }
  return in_RDI;
}

Assistant:

DEdgeVec GrowRootedTree( const Graph & T, size_t Root ) {
        DEdgeVec result;
        if( T.size() == 0 )
            return result;
        else {
            // Make a copy
            Graph Gr = T;

            // Nodes in the tree
            set<size_t> treeV;

            // Start with the root
            treeV.insert( Root );
            
            // Keep adding edges until done
            while( !(Gr.empty()) )
                for( Graph::iterator e = Gr.begin(); e != Gr.end(); ) {
                    bool e1_in_treeV = treeV.count( e->n1 );
                    bool e2_in_treeV = treeV.count( e->n2 );
                    assert( !(e1_in_treeV && e2_in_treeV) );
                    if( e1_in_treeV ) {
                        // Add directed edge, pointing away from the root
                        result.push_back( DEdge( e->n1, e->n2 ) );
                        treeV.insert( e->n2 );
                        // Erase the edge
                        Gr.erase( e++ );
                    } else if( e2_in_treeV ) {
                        result.push_back( DEdge( e->n2, e->n1 ) );
                        treeV.insert( e->n1 );
                        // Erase the edge
                        Gr.erase( e++ );
                    } else
                        e++;
                }

            return result;
        }
    }